

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall YAML::SingleDocParser::HandleNode(SingleDocParser *this,EventHandler *eventHandler)

{
  bool bVar1;
  int iVar2;
  TYPE TVar3;
  value vVar4;
  Token *pTVar5;
  anchor_t aVar6;
  uint uVar7;
  Mark MVar8;
  long lStack_b0;
  Mark mark;
  allocator local_91;
  anchor_t anchor;
  string tag;
  DepthGuard<500> depthguard;
  string anchor_name;
  allocator local_40 [32];
  
  MVar8 = Scanner::mark(this->m_scanner);
  anchor_name._M_dataplus._M_p = MVar8._0_8_;
  anchor_name._M_string_length._0_4_ = MVar8.column;
  std::__cxx11::string::string((string *)&tag,"bad file",local_40);
  DepthGuard<500>::DepthGuard(&depthguard,&this->depth,(Mark *)&anchor_name,&tag);
  std::__cxx11::string::~string((string *)&tag);
  bVar1 = Scanner::empty(this->m_scanner);
  if (bVar1) {
    MVar8 = Scanner::mark(this->m_scanner);
    tag._M_dataplus._M_p = MVar8._0_8_;
    tag._M_string_length._0_4_ = MVar8.column;
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&tag,0);
    goto LAB_006aaf80;
  }
  pTVar5 = Scanner::peek(this->m_scanner);
  mark.column = (pTVar5->mark).column;
  mark.pos = (pTVar5->mark).pos;
  mark.line = (pTVar5->mark).line;
  pTVar5 = Scanner::peek(this->m_scanner);
  if (pTVar5->type == VALUE) {
    std::__cxx11::string::string((string *)&tag,"?",(allocator *)&anchor_name);
    (*eventHandler->_vptr_EventHandler[9])(eventHandler,&mark,&tag,0,0);
    std::__cxx11::string::~string((string *)&tag);
    HandleMap(this,eventHandler);
    (*eventHandler->_vptr_EventHandler[10])(eventHandler);
    goto LAB_006aaf80;
  }
  pTVar5 = Scanner::peek(this->m_scanner);
  if (pTVar5->type == ALIAS) {
    pTVar5 = Scanner::peek(this->m_scanner);
    aVar6 = LookupAnchor(this,&mark,&pTVar5->value);
    (*eventHandler->_vptr_EventHandler[5])(eventHandler,&mark,aVar6);
    Scanner::pop(this->m_scanner);
    goto LAB_006aaf80;
  }
  tag._M_dataplus._M_p = (pointer)&tag.field_2;
  tag._M_string_length._0_4_ = 0;
  tag._M_string_length._4_4_ = 0;
  tag.field_2._M_local_buf[0] = '\0';
  anchor_name._M_dataplus._M_p = (pointer)&anchor_name.field_2;
  anchor_name._M_string_length._0_4_ = 0;
  anchor_name._M_string_length._4_4_ = 0;
  anchor_name.field_2._M_local_buf[0] = '\0';
  ParseProperties(this,&tag,&anchor,&anchor_name);
  if (CONCAT44(anchor_name._M_string_length._4_4_,(int)anchor_name._M_string_length) != 0) {
    (*eventHandler->_vptr_EventHandler[0xb])(eventHandler,&mark,&anchor_name);
  }
  bVar1 = Scanner::empty(this->m_scanner);
  if (bVar1) {
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&mark,anchor);
    goto LAB_006aaf6c;
  }
  pTVar5 = Scanner::peek(this->m_scanner);
  if (CONCAT44(tag._M_string_length._4_4_,(int)tag._M_string_length) == 0) {
    std::__cxx11::string::assign((char *)&tag);
  }
  TVar3 = pTVar5->type;
  if (TVar3 == PLAIN_SCALAR) {
    iVar2 = std::__cxx11::string::compare((char *)&tag);
    if ((iVar2 != 0) || (bVar1 = IsNullString(&pTVar5->value), !bVar1)) {
      TVar3 = pTVar5->type;
      goto LAB_006aaea9;
    }
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&mark,anchor);
LAB_006aaf1c:
    Scanner::pop(this->m_scanner);
    goto LAB_006aaf6c;
  }
LAB_006aaea9:
  uVar7 = 2;
  switch(TVar3) {
  case BLOCK_SEQ_START:
    uVar7 = 1;
  case FLOW_SEQ_START:
    (*eventHandler->_vptr_EventHandler[7])(eventHandler,&mark,&tag,anchor,(ulong)uVar7);
    HandleSequence(this,eventHandler);
    lStack_b0 = 0x40;
    goto LAB_006aaf62;
  case BLOCK_MAP_START:
    uVar7 = 1;
    break;
  case BLOCK_SEQ_END:
  case BLOCK_MAP_END:
  case BLOCK_ENTRY:
  case FLOW_SEQ_END:
  case FLOW_MAP_END:
  case FLOW_MAP_COMPACT:
  case FLOW_ENTRY:
    goto switchD_006aaec2_caseD_5;
  case FLOW_MAP_START:
    break;
  case KEY:
    vVar4 = CollectionStack::GetCurCollectionType
                      ((this->m_pCollectionStack)._M_t.
                       super___uniq_ptr_impl<YAML::CollectionStack,_std::default_delete<YAML::CollectionStack>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_YAML::CollectionStack_*,_std::default_delete<YAML::CollectionStack>_>
                       .super__Head_base<0UL,_YAML::CollectionStack_*,_false>._M_head_impl);
    if (vVar4 != FlowSeq) goto switchD_006aaec2_caseD_5;
    break;
  default:
    if (TVar3 - PLAIN_SCALAR < 2) {
      (*eventHandler->_vptr_EventHandler[6])(eventHandler,&mark,&tag,anchor,&pTVar5->value);
      goto LAB_006aaf1c;
    }
    goto switchD_006aaec2_caseD_5;
  }
  (*eventHandler->_vptr_EventHandler[9])(eventHandler,&mark,&tag,anchor,(ulong)uVar7);
  HandleMap(this,eventHandler);
  lStack_b0 = 0x50;
LAB_006aaf62:
  (**(code **)((long)eventHandler->_vptr_EventHandler + lStack_b0))(eventHandler);
LAB_006aaf6c:
  std::__cxx11::string::~string((string *)&anchor_name);
  std::__cxx11::string::~string((string *)&tag);
LAB_006aaf80:
  *depthguard.m_depth = *depthguard.m_depth + -1;
  return;
switchD_006aaec2_caseD_5:
  bVar1 = std::operator==(&tag,"?");
  if (bVar1) {
    (*eventHandler->_vptr_EventHandler[4])(eventHandler,&mark,anchor);
  }
  else {
    std::__cxx11::string::string((string *)local_40,"",&local_91);
    (*eventHandler->_vptr_EventHandler[6])(eventHandler,&mark,&tag,anchor,local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  goto LAB_006aaf6c;
}

Assistant:

void SingleDocParser::HandleNode(EventHandler& eventHandler) {
  DepthGuard<500> depthguard(depth, m_scanner.mark(), ErrorMsg::BAD_FILE);

  // an empty node *is* a possibility
  if (m_scanner.empty()) {
    eventHandler.OnNull(m_scanner.mark(), NullAnchor);
    return;
  }

  // save location
  Mark mark = m_scanner.peek().mark;

  // special case: a value node by itself must be a map, with no header
  if (m_scanner.peek().type == Token::VALUE) {
    eventHandler.OnMapStart(mark, "?", NullAnchor, EmitterStyle::Default);
    HandleMap(eventHandler);
    eventHandler.OnMapEnd();
    return;
  }

  // special case: an alias node
  if (m_scanner.peek().type == Token::ALIAS) {
    eventHandler.OnAlias(mark, LookupAnchor(mark, m_scanner.peek().value));
    m_scanner.pop();
    return;
  }

  std::string tag;
  std::string anchor_name;
  anchor_t anchor;
  ParseProperties(tag, anchor, anchor_name);

  if (!anchor_name.empty())
    eventHandler.OnAnchor(mark, anchor_name);

  // after parsing properties, an empty node is again a possibility
  if (m_scanner.empty()) {
    eventHandler.OnNull(mark, anchor);
    return;
  }

  const Token& token = m_scanner.peek();

  // add non-specific tags
  if (tag.empty())
    tag = (token.type == Token::NON_PLAIN_SCALAR ? "!" : "?");
  
  if (token.type == Token::PLAIN_SCALAR 
      && tag.compare("?") == 0 && IsNullString(token.value)) {
    eventHandler.OnNull(mark, anchor);
    m_scanner.pop();
    return;
  }

  // now split based on what kind of node we should be
  switch (token.type) {
    case Token::PLAIN_SCALAR:
    case Token::NON_PLAIN_SCALAR:
      eventHandler.OnScalar(mark, tag, anchor, token.value);
      m_scanner.pop();
      return;
    case Token::FLOW_SEQ_START:
      eventHandler.OnSequenceStart(mark, tag, anchor, EmitterStyle::Flow);
      HandleSequence(eventHandler);
      eventHandler.OnSequenceEnd();
      return;
    case Token::BLOCK_SEQ_START:
      eventHandler.OnSequenceStart(mark, tag, anchor, EmitterStyle::Block);
      HandleSequence(eventHandler);
      eventHandler.OnSequenceEnd();
      return;
    case Token::FLOW_MAP_START:
      eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Flow);
      HandleMap(eventHandler);
      eventHandler.OnMapEnd();
      return;
    case Token::BLOCK_MAP_START:
      eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Block);
      HandleMap(eventHandler);
      eventHandler.OnMapEnd();
      return;
    case Token::KEY:
      // compact maps can only go in a flow sequence
      if (m_pCollectionStack->GetCurCollectionType() ==
          CollectionType::FlowSeq) {
        eventHandler.OnMapStart(mark, tag, anchor, EmitterStyle::Flow);
        HandleMap(eventHandler);
        eventHandler.OnMapEnd();
        return;
      }
      break;
    default:
      break;
  }

  if (tag == "?")
    eventHandler.OnNull(mark, anchor);
  else
    eventHandler.OnScalar(mark, tag, anchor, "");
}